

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execCmp<(moira::Instr)37,(moira::Mode)8,(moira::Size)1>(Moira *this,u16 opcode)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  u32 uVar4;
  int iVar5;
  
  uVar4 = computeEA<(moira::Mode)8,(moira::Size)1,0ul>(this,opcode & 7);
  uVar4 = readM<(moira::MemSpace)1,(moira::Size)1,0ul>(this,uVar4);
  uVar1 = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
  iVar5 = (uVar1 & 0xff) - uVar4;
  (this->reg).sr.c = (bool)((byte)((uint)iVar5 >> 8) & 1);
  bVar3 = (byte)uVar1;
  bVar2 = (byte)iVar5;
  (this->reg).sr.v = (bool)((byte)((bVar2 ^ bVar3) & ((byte)uVar4 ^ bVar3)) >> 7);
  (this->reg).sr.z = bVar2 == 0;
  (this->reg).sr.n = (bool)(bVar2 >> 7);
  uVar4 = (this->reg).pc;
  (this->reg).pc0 = uVar4;
  (this->queue).ird = (this->queue).irc;
  uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar4 + 2);
  (this->queue).irc = (u16)uVar4;
  return;
}

Assistant:

void
Moira::execCmp(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    cmp<S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(2);
}